

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_empty.cc
# Opt level: O2

void __thiscall re2c::Skeleton::warn_match_empty(Skeleton *this)

{
  Node *this_00;
  bool bVar1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  
  this_00 = this->nodes;
  Node::calc_reachable(this_00);
  bVar1 = rule_rank_t::is_none(&(this_00->rule).rank);
  if (!bVar1) {
    bVar1 = Node::end(this_00);
    p_Var2 = (this_00->reachable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (bVar1 == false) {
      if ((_Rb_tree_header *)p_Var2 == &(this_00->reachable)._M_t._M_impl.super__Rb_tree_header)
      goto LAB_00140d78;
      bVar1 = rule_rank_t::is_none((rule_rank_t *)(p_Var2 + 1));
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    }
    pmVar3 = std::
             map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
             ::operator[](&this->rules,&(this_00->rule).rank);
    Warn::match_empty_string((Warn *)warn,pmVar3->line);
  }
LAB_00140d78:
  if (this_00->ctx == true) {
    for (p_Var2 = (this_00->reachable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this_00->reachable)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      if (p_Var2[1].field_0x4 == '\x01') {
        pmVar3 = std::
                 map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
                 ::operator[](&this->rules,(key_type *)(p_Var2 + 1));
        Warn::match_empty_string((Warn *)warn,pmVar3->line);
      }
    }
  }
  return;
}

Assistant:

void Skeleton::warn_match_empty ()
{
	Node & head = nodes[0];

	head.calc_reachable ();
	const std::set<rule_t> & reach = head.reachable;

	// warn about rules that match empty string
	if (!head.rule.rank.is_none ())
	{
		bool reachable = head.end ();
		for (std::set<rule_t>::const_iterator i = reach.begin ();
			!reachable && i != reach.end (); ++i)
		{
			reachable |= i->rank.is_none ();
		}
		if (reachable)
		{
			warn.match_empty_string (rules[head.rule.rank].line);
		}
	}

	// warn about rules that match empty string with nonempty trailing context
	if (head.ctx)
	{
		for (std::set<rule_t>::const_iterator i = reach.begin (); i != reach.end (); ++i)
		{
			if (i->restorectx)
			{
				warn.match_empty_string (rules[i->rank].line);
			}
		}
	}
}